

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O1

void __thiscall embree::SubdivMesh::initializeHalfEdgeStructures(SubdivMesh *this)

{
  mvector<uint32_t> *pmVar1;
  char *ptr;
  uint *puVar2;
  MemoryMonitorInterface *pMVar3;
  size_t sVar4;
  RawBufferView *pRVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vector_t<unsigned_int,_embree::aligned_monitored_allocator<unsigned_int,_4UL>_> *pvVar34;
  ulong uVar35;
  char cVar36;
  bool bVar37;
  uint uVar38;
  int iVar39;
  char *pcVar40;
  uint *puVar41;
  ulong uVar42;
  ostream *poVar43;
  runtime_error *prVar44;
  long lVar45;
  bool *pbVar46;
  unsigned_long uVar47;
  ulong uVar48;
  pointer pvVar49;
  ulong uVar50;
  Topology *t;
  Topology *this_00;
  long lVar51;
  undefined1 auVar52 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar75;
  int iVar76;
  undefined1 auVar73 [16];
  int iVar77;
  undefined1 auVar74 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  int iVar91;
  int iVar95;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  size_t taskCount;
  task_group_context context;
  ParallelPrefixSumState<int> state;
  undefined1 local_336 [2];
  uint local_334;
  vector_t<unsigned_int,_embree::aligned_monitored_allocator<unsigned_int,_4UL>_> *local_330;
  unsigned_long local_328;
  unsigned_long local_320;
  ulong local_318;
  BufferView<unsigned_int> *local_310;
  double local_308;
  anon_class_8_1_898bcfc2_conflict23 local_300;
  anon_class_32_4_2dac733d_conflict local_2f8;
  anon_class_40_5_11684cf9_conflict6 local_2d8;
  task_group_context local_2b0;
  ParallelPrefixSumState<int> local_230;
  
  local_308 = getSeconds();
  uVar50 = (ulong)(this->super_Geometry).numTimeSteps * (this->faceVertices).super_RawBufferView.num
  ;
  uVar42 = (this->invalid_face).size_alloced;
  uVar48 = uVar42;
  if ((uVar42 < uVar50) && (uVar48 = uVar50, uVar35 = uVar42, uVar42 != 0)) {
    while (uVar48 = uVar35, uVar48 < uVar50) {
      uVar35 = uVar48 * 2 + (ulong)(uVar48 * 2 == 0);
    }
  }
  if (uVar50 < (this->invalid_face).size_active) {
    (this->invalid_face).size_active = uVar50;
  }
  if (uVar42 == uVar48) {
    (this->invalid_face).size_active = uVar50;
  }
  else {
    ptr = (this->invalid_face).items;
    if (uVar48 != 0) {
      pMVar3 = (this->invalid_face).alloc.device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,uVar48,0);
    }
    if (uVar48 < 0x1c00000) {
      pcVar40 = (char *)alignedMalloc(uVar48,1);
    }
    else {
      pcVar40 = (char *)os_malloc(uVar48,&(this->invalid_face).alloc.hugepages);
    }
    (this->invalid_face).items = pcVar40;
    if ((this->invalid_face).size_active != 0) {
      uVar42 = 0;
      do {
        (this->invalid_face).items[uVar42] = ptr[uVar42];
        uVar42 = uVar42 + 1;
      } while (uVar42 < (this->invalid_face).size_active);
    }
    uVar42 = (this->invalid_face).size_alloced;
    if (ptr != (char *)0x0) {
      if (uVar42 < 0x1c00000) {
        alignedFree(ptr);
      }
      else {
        os_free(ptr,uVar42,(this->invalid_face).alloc.hugepages);
      }
    }
    if (uVar42 != 0) {
      pMVar3 = (this->invalid_face).alloc.device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,-uVar42,1);
    }
    (this->invalid_face).size_active = uVar50;
    (this->invalid_face).size_alloced = uVar48;
  }
  uVar42 = (this->faceVertices).super_RawBufferView.num;
  uVar48 = (this->faceStartEdge).size_alloced;
  uVar50 = uVar48;
  if ((uVar48 < uVar42) && (uVar50 = uVar42, uVar48 != 0)) {
    while (uVar50 = uVar48, uVar50 < uVar42) {
      uVar48 = uVar50 * 2 + (ulong)(uVar50 * 2 == 0);
    }
  }
  if (uVar42 < (this->faceStartEdge).size_active) {
    (this->faceStartEdge).size_active = uVar42;
  }
  pmVar1 = &this->faceStartEdge;
  if ((this->faceStartEdge).size_alloced == uVar50) {
    (this->faceStartEdge).size_active = uVar42;
  }
  else {
    puVar2 = (this->faceStartEdge).items;
    if (uVar50 != 0) {
      pMVar3 = (pmVar1->alloc).device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,uVar50 * 4,0);
    }
    uVar48 = uVar50 * 4;
    if (uVar48 < 0x1c00000) {
      puVar41 = (uint *)alignedMalloc(uVar48,4);
    }
    else {
      puVar41 = (uint *)os_malloc(uVar48,&(this->faceStartEdge).alloc.hugepages);
    }
    (this->faceStartEdge).items = puVar41;
    if ((this->faceStartEdge).size_active != 0) {
      uVar48 = 0;
      do {
        (this->faceStartEdge).items[uVar48] = puVar2[uVar48];
        uVar48 = uVar48 + 1;
      } while (uVar48 < (this->faceStartEdge).size_active);
    }
    sVar4 = (this->faceStartEdge).size_alloced;
    if (puVar2 != (uint *)0x0) {
      if (sVar4 * 4 < 0x1c00000) {
        alignedFree(puVar2);
      }
      else {
        os_free(puVar2,sVar4 * 4,(this->faceStartEdge).alloc.hugepages);
      }
    }
    if (sVar4 != 0) {
      pMVar3 = (pmVar1->alloc).device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar4 * -4,1);
    }
    (this->faceStartEdge).size_active = uVar42;
    (this->faceStartEdge).size_alloced = uVar50;
  }
  if ((this->faceVertices).super_RawBufferView.modified == true) {
    uVar42 = (this->faceVertices).super_RawBufferView.num;
    local_334 = 0;
    if (uVar42 < 0x1000) {
      if (uVar42 == 0) {
        uVar38 = 0;
      }
      else {
        uVar38 = 0;
        uVar48 = 0;
        do {
          (this->faceStartEdge).items[uVar48] = uVar38;
          uVar50 = uVar48 + 1;
          uVar38 = uVar38 + *(int *)((this->faceVertices).super_RawBufferView.ptr_ofs +
                                    uVar48 * (this->faceVertices).super_RawBufferView.stride);
          uVar48 = uVar50;
        } while (uVar42 != uVar50);
      }
    }
    else {
      local_310 = &this->faceVertices;
      local_2f8.identity = (int *)&local_334;
      local_2f8.dst =
           (vector_t<unsigned_int,_embree::aligned_monitored_allocator<unsigned_int,_4UL>_> *)
           local_336;
      local_320 = 0;
      local_330 = pmVar1;
      local_318 = uVar42;
      local_2f8.add = (plus<unsigned_int> *)local_310;
      iVar39 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      uVar48 = (local_318 - local_320) + 0x3ff >> 10;
      if ((ulong)(long)iVar39 < uVar48) {
        uVar48 = (long)iVar39;
      }
      uVar47 = 0x40;
      if (uVar48 < 0x40) {
        uVar47 = uVar48;
      }
      local_2d8.taskCount = &local_328;
      local_2d8.state = &local_230;
      local_2b0.my_version = proxy_support;
      local_2b0.my_traits = (context_traits)0x4;
      local_2b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
      local_2b0.my_node.my_next_node = (intrusive_list_node *)0x0;
      local_2b0.my_name = CUSTOM_CTX;
      local_328 = uVar47;
      local_2d8.first = &local_320;
      local_2d8.last = &local_318;
      local_2d8.func = &local_2f8;
      tbb::detail::r1::initialize(&local_2b0);
      local_300.func = &local_2d8;
      tbb::detail::d1::
      parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
                (0,uVar47,1,(anon_class_8_1_898bcfc2_conflict22 *)&local_300,
                 (auto_partitioner *)(local_336 + 1),&local_2b0);
      cVar36 = tbb::detail::r1::is_group_execution_cancelled(&local_2b0);
      pvVar34 = local_330;
      if (cVar36 != '\0') {
        prVar44 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar44,"task cancelled");
        __cxa_throw(prVar44,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy(&local_2b0);
      if (local_328 != 0) {
        uVar47 = 0;
        uVar38 = local_334;
        do {
          local_230.sums[uVar47] = uVar38;
          uVar38 = uVar38 + local_230.counts[uVar47];
          uVar47 = uVar47 + 1;
        } while (local_328 != uVar47);
      }
      local_2f8.identity = (int *)&local_334;
      local_2f8.dst = pvVar34;
      local_2f8.add = (plus<unsigned_int> *)local_336;
      local_2f8.src = local_310;
      local_320 = 0;
      local_318 = uVar42;
      iVar39 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      uVar42 = (local_318 - local_320) + 0x3ff >> 10;
      if ((ulong)(long)iVar39 < uVar42) {
        uVar42 = (long)iVar39;
      }
      uVar47 = 0x40;
      if (uVar42 < 0x40) {
        uVar47 = uVar42;
      }
      local_2d8.first = &local_320;
      local_2d8.taskCount = &local_328;
      local_2d8.state = &local_230;
      local_2d8.func = &local_2f8;
      local_2b0.my_version = proxy_support;
      local_2b0.my_traits = (context_traits)0x4;
      local_2b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
      local_2b0.my_node.my_next_node = (intrusive_list_node *)0x0;
      local_2b0.my_name = CUSTOM_CTX;
      local_328 = uVar47;
      local_2d8.last = &local_318;
      tbb::detail::r1::initialize(&local_2b0);
      local_300.func = &local_2d8;
      tbb::detail::d1::
      parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
                (0,uVar47,1,&local_300,(auto_partitioner *)(local_336 + 1),&local_2b0);
      cVar36 = tbb::detail::r1::is_group_execution_cancelled(&local_2b0);
      if (cVar36 != '\0') {
        prVar44 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar44,"task cancelled");
        __cxa_throw(prVar44,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy(&local_2b0);
      in_XMM1._8_8_ = extraout_XMM1_Qb;
      in_XMM1._0_8_ = extraout_XMM1_Qa;
      uVar38 = local_334;
      if (local_328 != 0) {
        uVar47 = 0;
        do {
          local_230.sums[uVar47] = uVar38;
          uVar38 = uVar38 + local_230.counts[uVar47];
          uVar47 = uVar47 + 1;
        } while (local_328 != uVar47);
      }
    }
    uVar50 = (ulong)(int)uVar38;
    this->numHalfEdges = uVar50;
    uVar42 = (this->halfEdgeFace).size_alloced;
    uVar48 = uVar42;
    if ((uVar42 < uVar50) && (uVar48 = uVar50, uVar42 != 0)) {
      while (uVar48 = uVar42, uVar48 < uVar50) {
        uVar42 = uVar48 * 2 + (ulong)(uVar48 * 2 == 0);
      }
    }
    if (uVar50 < (this->halfEdgeFace).size_active) {
      (this->halfEdgeFace).size_active = uVar50;
    }
    if ((this->halfEdgeFace).size_alloced == uVar48) {
      (this->halfEdgeFace).size_active = uVar50;
    }
    else {
      puVar2 = (this->halfEdgeFace).items;
      if (uVar48 != 0) {
        pMVar3 = (this->halfEdgeFace).alloc.device;
        (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,uVar48 * 4,0);
      }
      uVar42 = uVar48 * 4;
      if (uVar42 < 0x1c00000) {
        puVar41 = (uint *)alignedMalloc(uVar42,4);
      }
      else {
        puVar41 = (uint *)os_malloc(uVar42,&(this->halfEdgeFace).alloc.hugepages);
      }
      (this->halfEdgeFace).items = puVar41;
      if ((this->halfEdgeFace).size_active != 0) {
        uVar42 = 0;
        do {
          (this->halfEdgeFace).items[uVar42] = puVar2[uVar42];
          uVar42 = uVar42 + 1;
        } while (uVar42 < (this->halfEdgeFace).size_active);
      }
      sVar4 = (this->halfEdgeFace).size_alloced;
      if (puVar2 != (uint *)0x0) {
        if (sVar4 * 4 < 0x1c00000) {
          alignedFree(puVar2);
        }
        else {
          os_free(puVar2,sVar4 * 4,(this->halfEdgeFace).alloc.hugepages);
        }
      }
      if (sVar4 != 0) {
        pMVar3 = (this->halfEdgeFace).alloc.device;
        (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar4 * -4,1);
      }
      (this->halfEdgeFace).size_active = uVar50;
      (this->halfEdgeFace).size_alloced = uVar48;
    }
    if ((this->faceVertices).super_RawBufferView.num != 0) {
      uVar42 = 0;
      lVar45 = 0;
      do {
        if (*(int *)((this->faceVertices).super_RawBufferView.ptr_ofs +
                    (this->faceVertices).super_RawBufferView.stride * uVar42) != 0) {
          uVar48 = 0;
          do {
            (this->halfEdgeFace).items[lVar45] = (uint)uVar42;
            lVar45 = lVar45 + 1;
            uVar48 = uVar48 + 1;
          } while (uVar48 < *(uint *)((this->faceVertices).super_RawBufferView.ptr_ofs +
                                     (this->faceVertices).super_RawBufferView.stride * uVar42));
        }
        uVar42 = uVar42 + 1;
      } while (uVar42 < (this->faceVertices).super_RawBufferView.num);
    }
  }
  if (((this->vertex_creases).super_RawBufferView.modified != false) ||
     ((this->vertex_crease_weights).super_RawBufferView.modified == true)) {
    parallel_map<unsigned_int,float>::
    init<embree::BufferView<unsigned_int>,embree::BufferView<float>>
              ((parallel_map<unsigned_int,float> *)
               (this->vertexCreaseMap)._M_t.
               super___uniq_ptr_impl<embree::VertexCreaseMap,_std::default_delete<embree::VertexCreaseMap>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::VertexCreaseMap_*,_std::default_delete<embree::VertexCreaseMap>_>
               .super__Head_base<0UL,_embree::VertexCreaseMap_*,_false>._M_head_impl,
               &this->vertex_creases,&this->vertex_crease_weights);
  }
  if (((this->edge_creases).super_RawBufferView.modified != false) ||
     ((this->edge_crease_weights).super_RawBufferView.modified == true)) {
    parallel_map<unsigned_long,float>::
    init<embree::BufferView<embree::HalfEdge::Edge>,embree::BufferView<float>>
              ((parallel_map<unsigned_long,float> *)
               (this->edgeCreaseMap)._M_t.
               super___uniq_ptr_impl<embree::EdgeCreaseMap,_std::default_delete<embree::EdgeCreaseMap>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::EdgeCreaseMap_*,_std::default_delete<embree::EdgeCreaseMap>_>
               .super__Head_base<0UL,_embree::EdgeCreaseMap_*,_false>._M_head_impl,
               &this->edge_creases,&this->edge_crease_weights);
  }
  if ((this->holes).super_RawBufferView.modified == true) {
    parallel_set<unsigned_int>::init<embree::BufferView<unsigned_int>>
              (&((this->holeSet)._M_t.
                 super___uniq_ptr_impl<embree::HoleSet,_std::default_delete<embree::HoleSet>_>._M_t.
                 super__Tuple_impl<0UL,_embree::HoleSet_*,_std::default_delete<embree::HoleSet>_>.
                 super__Head_base<0UL,_embree::HoleSet_*,_false>._M_head_impl)->holeSet,&this->holes
              );
  }
  sVar4 = (this->topology).size_active;
  if (sVar4 != 0) {
    this_00 = (this->topology).items;
    lVar45 = sVar4 * 0xa0;
    do {
      Topology::initializeHalfEdgeStructures(this_00);
      this_00 = this_00 + 1;
      lVar45 = lVar45 + -0xa0;
    } while (lVar45 != 0);
  }
  pvVar49 = (this->vertex_buffer_tags).
            super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vertex_buffer_tags).
      super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar49) {
    lVar45 = 0x10;
    lVar51 = 0;
    uVar42 = 0;
    do {
      std::
      vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
      ::resize((vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                *)((long)&(pvVar49->
                          super__Vector_base<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar51),
               ((ulong)*(uint *)((long)&(((this->vertices).items)->super_RawBufferView).ptr_ofs +
                                lVar45) + 0xf >> 4) * (this->faceVertices).super_RawBufferView.num);
      uVar42 = uVar42 + 1;
      pvVar49 = (this->vertex_buffer_tags).
                super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar51 = lVar51 + 0x18;
      lVar45 = lVar45 + 0x38;
    } while (uVar42 < (ulong)(((long)(this->vertex_buffer_tags).
                                     super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar49 >> 3
                              ) * -0x5555555555555555));
  }
  if ((this->vertexAttribs).size_active != 0) {
    lVar45 = 0x10;
    lVar51 = 0;
    uVar42 = 0;
    do {
      pRVar5 = (this->vertexAttribs).items;
      if (*(long *)((long)pRVar5 + lVar45 + -0x10) != 0) {
        std::
        vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
        ::resize((vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                  *)((long)&(((this->vertex_attrib_buffer_tags).
                              super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar51),
                 ((ulong)*(uint *)((long)&pRVar5->ptr_ofs + lVar45) + 0xf >> 4) *
                 (this->faceVertices).super_RawBufferView.num);
      }
      uVar42 = uVar42 + 1;
      lVar45 = lVar45 + 0x38;
      lVar51 = lVar51 + 0x18;
    } while (uVar42 < (this->vertexAttribs).size_active);
  }
  (this->faceVertices).super_RawBufferView.modified = false;
  (this->holes).super_RawBufferView.modified = false;
  auVar33 = _DAT_0201ceb0;
  auVar32 = _DAT_0201cea0;
  auVar31 = _DAT_0201ce90;
  auVar30 = _DAT_0201ce80;
  auVar29 = _DAT_0201ce70;
  auVar28 = _DAT_01fecaf0;
  auVar62 = _DAT_01fec6d0;
  sVar4 = (this->vertices).size_active;
  if (sVar4 != 0) {
    uVar42 = sVar4 * 0x38 - 0x38 >> 3;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar42;
    auVar52._8_4_ = SUB164(auVar73 * ZEXT816(0x2492492492492493),8);
    auVar52._0_8_ = uVar42 / 7;
    auVar52._12_4_ = (int)(uVar42 / 0x700000000);
    pbVar46 = &(this->vertices).items[0xf].super_RawBufferView.modified;
    uVar48 = 0;
    do {
      auVar71._8_4_ = (int)uVar48;
      auVar71._0_8_ = uVar48;
      auVar71._12_4_ = (int)(uVar48 >> 0x20);
      auVar73 = auVar52 ^ auVar62;
      auVar78 = (auVar71 | auVar28) ^ auVar62;
      iVar39 = auVar73._0_4_;
      iVar91 = -(uint)(iVar39 < auVar78._0_4_);
      iVar75 = auVar73._4_4_;
      auVar80._4_4_ = -(uint)(iVar75 < auVar78._4_4_);
      iVar76 = auVar73._8_4_;
      iVar95 = -(uint)(iVar76 < auVar78._8_4_);
      iVar77 = auVar73._12_4_;
      auVar80._12_4_ = -(uint)(iVar77 < auVar78._12_4_);
      auVar53._4_4_ = iVar91;
      auVar53._0_4_ = iVar91;
      auVar53._8_4_ = iVar95;
      auVar53._12_4_ = iVar95;
      auVar73 = pshuflw(in_XMM1,auVar53,0xe8);
      auVar79._4_4_ = -(uint)(auVar78._4_4_ == iVar75);
      auVar79._12_4_ = -(uint)(auVar78._12_4_ == iVar77);
      auVar79._0_4_ = auVar79._4_4_;
      auVar79._8_4_ = auVar79._12_4_;
      auVar63 = pshuflw(in_XMM2,auVar79,0xe8);
      auVar80._0_4_ = auVar80._4_4_;
      auVar80._8_4_ = auVar80._12_4_;
      auVar53 = pshuflw(auVar73,auVar80,0xe8);
      auVar78._8_4_ = 0xffffffff;
      auVar78._0_8_ = 0xffffffffffffffff;
      auVar78._12_4_ = 0xffffffff;
      auVar78 = (auVar53 | auVar63 & auVar73) ^ auVar78;
      auVar73 = packssdw(auVar78,auVar78);
      if ((auVar73 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pbVar46[-0x348] = false;
      }
      auVar15._4_4_ = iVar91;
      auVar15._0_4_ = iVar91;
      auVar15._8_4_ = iVar95;
      auVar15._12_4_ = iVar95;
      auVar80 = auVar79 & auVar15 | auVar80;
      auVar73 = packssdw(auVar80,auVar80);
      auVar63._8_4_ = 0xffffffff;
      auVar63._0_8_ = 0xffffffffffffffff;
      auVar63._12_4_ = 0xffffffff;
      auVar73 = packssdw(auVar73 ^ auVar63,auVar73 ^ auVar63);
      auVar73 = packsswb(auVar73,auVar73);
      if ((auVar73._0_4_ >> 8 & 1) != 0) {
        pbVar46[-0x310] = false;
      }
      auVar73 = (auVar71 | auVar33) ^ auVar62;
      auVar64._0_4_ = -(uint)(iVar39 < auVar73._0_4_);
      auVar64._4_4_ = -(uint)(iVar75 < auVar73._4_4_);
      auVar64._8_4_ = -(uint)(iVar76 < auVar73._8_4_);
      auVar64._12_4_ = -(uint)(iVar77 < auVar73._12_4_);
      auVar81._4_4_ = auVar64._0_4_;
      auVar81._0_4_ = auVar64._0_4_;
      auVar81._8_4_ = auVar64._8_4_;
      auVar81._12_4_ = auVar64._8_4_;
      iVar91 = -(uint)(auVar73._4_4_ == iVar75);
      iVar95 = -(uint)(auVar73._12_4_ == iVar77);
      auVar16._4_4_ = iVar91;
      auVar16._0_4_ = iVar91;
      auVar16._8_4_ = iVar95;
      auVar16._12_4_ = iVar95;
      auVar92._4_4_ = auVar64._4_4_;
      auVar92._0_4_ = auVar64._4_4_;
      auVar92._8_4_ = auVar64._12_4_;
      auVar92._12_4_ = auVar64._12_4_;
      auVar73 = auVar16 & auVar81 | auVar92;
      auVar73 = packssdw(auVar73,auVar73);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar73 = packssdw(auVar73 ^ auVar6,auVar73 ^ auVar6);
      auVar73 = packsswb(auVar73,auVar73);
      if ((auVar73._0_4_ >> 0x10 & 1) != 0) {
        pbVar46[-0x2d8] = false;
      }
      auVar73 = pshufhw(auVar73,auVar81,0x84);
      auVar17._4_4_ = iVar91;
      auVar17._0_4_ = iVar91;
      auVar17._8_4_ = iVar95;
      auVar17._12_4_ = iVar95;
      auVar53 = pshufhw(auVar64,auVar17,0x84);
      auVar78 = pshufhw(auVar73,auVar92,0x84);
      auVar54._8_4_ = 0xffffffff;
      auVar54._0_8_ = 0xffffffffffffffff;
      auVar54._12_4_ = 0xffffffff;
      auVar54 = (auVar78 | auVar53 & auVar73) ^ auVar54;
      auVar73 = packssdw(auVar54,auVar54);
      auVar73 = packsswb(auVar73,auVar73);
      if ((auVar73._0_4_ >> 0x18 & 1) != 0) {
        pbVar46[-0x2a0] = false;
      }
      auVar73 = (auVar71 | auVar32) ^ auVar62;
      auVar65._0_4_ = -(uint)(iVar39 < auVar73._0_4_);
      auVar65._4_4_ = -(uint)(iVar75 < auVar73._4_4_);
      auVar65._8_4_ = -(uint)(iVar76 < auVar73._8_4_);
      auVar65._12_4_ = -(uint)(iVar77 < auVar73._12_4_);
      auVar18._4_4_ = auVar65._0_4_;
      auVar18._0_4_ = auVar65._0_4_;
      auVar18._8_4_ = auVar65._8_4_;
      auVar18._12_4_ = auVar65._8_4_;
      auVar53 = pshuflw(auVar92,auVar18,0xe8);
      auVar55._0_4_ = -(uint)(auVar73._0_4_ == iVar39);
      auVar55._4_4_ = -(uint)(auVar73._4_4_ == iVar75);
      auVar55._8_4_ = -(uint)(auVar73._8_4_ == iVar76);
      auVar55._12_4_ = -(uint)(auVar73._12_4_ == iVar77);
      auVar82._4_4_ = auVar55._4_4_;
      auVar82._0_4_ = auVar55._4_4_;
      auVar82._8_4_ = auVar55._12_4_;
      auVar82._12_4_ = auVar55._12_4_;
      auVar73 = pshuflw(auVar55,auVar82,0xe8);
      auVar83._4_4_ = auVar65._4_4_;
      auVar83._0_4_ = auVar65._4_4_;
      auVar83._8_4_ = auVar65._12_4_;
      auVar83._12_4_ = auVar65._12_4_;
      auVar78 = pshuflw(auVar65,auVar83,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar73 = packssdw(auVar73 & auVar53,(auVar78 | auVar73 & auVar53) ^ auVar7);
      auVar73 = packsswb(auVar73,auVar73);
      if ((auVar73 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar46[-0x268] = false;
      }
      auVar19._4_4_ = auVar65._0_4_;
      auVar19._0_4_ = auVar65._0_4_;
      auVar19._8_4_ = auVar65._8_4_;
      auVar19._12_4_ = auVar65._8_4_;
      auVar83 = auVar82 & auVar19 | auVar83;
      auVar78 = packssdw(auVar83,auVar83);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar73 = packssdw(auVar73,auVar78 ^ auVar8);
      auVar73 = packsswb(auVar73,auVar73);
      if ((auVar73._4_2_ >> 8 & 1) != 0) {
        pbVar46[-0x230] = false;
      }
      auVar73 = (auVar71 | auVar31) ^ auVar62;
      auVar66._0_4_ = -(uint)(iVar39 < auVar73._0_4_);
      auVar66._4_4_ = -(uint)(iVar75 < auVar73._4_4_);
      auVar66._8_4_ = -(uint)(iVar76 < auVar73._8_4_);
      auVar66._12_4_ = -(uint)(iVar77 < auVar73._12_4_);
      auVar84._4_4_ = auVar66._0_4_;
      auVar84._0_4_ = auVar66._0_4_;
      auVar84._8_4_ = auVar66._8_4_;
      auVar84._12_4_ = auVar66._8_4_;
      iVar91 = -(uint)(auVar73._4_4_ == iVar75);
      iVar95 = -(uint)(auVar73._12_4_ == iVar77);
      auVar20._4_4_ = iVar91;
      auVar20._0_4_ = iVar91;
      auVar20._8_4_ = iVar95;
      auVar20._12_4_ = iVar95;
      auVar93._4_4_ = auVar66._4_4_;
      auVar93._0_4_ = auVar66._4_4_;
      auVar93._8_4_ = auVar66._12_4_;
      auVar93._12_4_ = auVar66._12_4_;
      auVar73 = auVar20 & auVar84 | auVar93;
      auVar73 = packssdw(auVar73,auVar73);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar73 = packssdw(auVar73 ^ auVar9,auVar73 ^ auVar9);
      auVar73 = packsswb(auVar73,auVar73);
      if ((auVar73 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar46[-0x1f8] = false;
      }
      auVar73 = pshufhw(auVar73,auVar84,0x84);
      auVar21._4_4_ = iVar91;
      auVar21._0_4_ = iVar91;
      auVar21._8_4_ = iVar95;
      auVar21._12_4_ = iVar95;
      auVar53 = pshufhw(auVar66,auVar21,0x84);
      auVar78 = pshufhw(auVar73,auVar93,0x84);
      auVar56._8_4_ = 0xffffffff;
      auVar56._0_8_ = 0xffffffffffffffff;
      auVar56._12_4_ = 0xffffffff;
      auVar56 = (auVar78 | auVar53 & auVar73) ^ auVar56;
      auVar73 = packssdw(auVar56,auVar56);
      auVar73 = packsswb(auVar73,auVar73);
      if ((auVar73._6_2_ >> 8 & 1) != 0) {
        pbVar46[-0x1c0] = false;
      }
      auVar73 = (auVar71 | auVar30) ^ auVar62;
      auVar67._0_4_ = -(uint)(iVar39 < auVar73._0_4_);
      auVar67._4_4_ = -(uint)(iVar75 < auVar73._4_4_);
      auVar67._8_4_ = -(uint)(iVar76 < auVar73._8_4_);
      auVar67._12_4_ = -(uint)(iVar77 < auVar73._12_4_);
      auVar22._4_4_ = auVar67._0_4_;
      auVar22._0_4_ = auVar67._0_4_;
      auVar22._8_4_ = auVar67._8_4_;
      auVar22._12_4_ = auVar67._8_4_;
      auVar53 = pshuflw(auVar93,auVar22,0xe8);
      auVar57._0_4_ = -(uint)(auVar73._0_4_ == iVar39);
      auVar57._4_4_ = -(uint)(auVar73._4_4_ == iVar75);
      auVar57._8_4_ = -(uint)(auVar73._8_4_ == iVar76);
      auVar57._12_4_ = -(uint)(auVar73._12_4_ == iVar77);
      auVar85._4_4_ = auVar57._4_4_;
      auVar85._0_4_ = auVar57._4_4_;
      auVar85._8_4_ = auVar57._12_4_;
      auVar85._12_4_ = auVar57._12_4_;
      auVar73 = pshuflw(auVar57,auVar85,0xe8);
      auVar86._4_4_ = auVar67._4_4_;
      auVar86._0_4_ = auVar67._4_4_;
      auVar86._8_4_ = auVar67._12_4_;
      auVar86._12_4_ = auVar67._12_4_;
      auVar78 = pshuflw(auVar67,auVar86,0xe8);
      auVar68._8_4_ = 0xffffffff;
      auVar68._0_8_ = 0xffffffffffffffff;
      auVar68._12_4_ = 0xffffffff;
      auVar68 = (auVar78 | auVar73 & auVar53) ^ auVar68;
      auVar78 = packssdw(auVar68,auVar68);
      auVar73 = packsswb(auVar73 & auVar53,auVar78);
      if ((auVar73 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pbVar46[-0x188] = false;
      }
      auVar23._4_4_ = auVar67._0_4_;
      auVar23._0_4_ = auVar67._0_4_;
      auVar23._8_4_ = auVar67._8_4_;
      auVar23._12_4_ = auVar67._8_4_;
      auVar86 = auVar85 & auVar23 | auVar86;
      auVar78 = packssdw(auVar86,auVar86);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar78 = packssdw(auVar78 ^ auVar10,auVar78 ^ auVar10);
      auVar73 = packsswb(auVar73,auVar78);
      if ((auVar73._8_2_ >> 8 & 1) != 0) {
        pbVar46[-0x150] = false;
      }
      auVar73 = (auVar71 | auVar29) ^ auVar62;
      auVar69._0_4_ = -(uint)(iVar39 < auVar73._0_4_);
      auVar69._4_4_ = -(uint)(iVar75 < auVar73._4_4_);
      auVar69._8_4_ = -(uint)(iVar76 < auVar73._8_4_);
      auVar69._12_4_ = -(uint)(iVar77 < auVar73._12_4_);
      auVar87._4_4_ = auVar69._0_4_;
      auVar87._0_4_ = auVar69._0_4_;
      auVar87._8_4_ = auVar69._8_4_;
      auVar87._12_4_ = auVar69._8_4_;
      iVar91 = -(uint)(auVar73._4_4_ == iVar75);
      iVar95 = -(uint)(auVar73._12_4_ == iVar77);
      auVar24._4_4_ = iVar91;
      auVar24._0_4_ = iVar91;
      auVar24._8_4_ = iVar95;
      auVar24._12_4_ = iVar95;
      auVar94._4_4_ = auVar69._4_4_;
      auVar94._0_4_ = auVar69._4_4_;
      auVar94._8_4_ = auVar69._12_4_;
      auVar94._12_4_ = auVar69._12_4_;
      auVar73 = auVar24 & auVar87 | auVar94;
      auVar73 = packssdw(auVar73,auVar73);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar73 = packssdw(auVar73 ^ auVar11,auVar73 ^ auVar11);
      auVar73 = packsswb(auVar73,auVar73);
      if ((auVar73 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pbVar46[-0x118] = false;
      }
      auVar73 = pshufhw(auVar73,auVar87,0x84);
      auVar25._4_4_ = iVar91;
      auVar25._0_4_ = iVar91;
      auVar25._8_4_ = iVar95;
      auVar25._12_4_ = iVar95;
      auVar53 = pshufhw(auVar69,auVar25,0x84);
      auVar78 = pshufhw(auVar73,auVar94,0x84);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar58 = (auVar78 | auVar53 & auVar73) ^ auVar58;
      auVar73 = packssdw(auVar58,auVar58);
      auVar73 = packsswb(auVar73,auVar73);
      if ((auVar73._10_2_ >> 8 & 1) != 0) {
        pbVar46[-0xe0] = false;
      }
      auVar73 = (auVar71 | _DAT_0201ce60) ^ auVar62;
      auVar70._0_4_ = -(uint)(iVar39 < auVar73._0_4_);
      auVar70._4_4_ = -(uint)(iVar75 < auVar73._4_4_);
      auVar70._8_4_ = -(uint)(iVar76 < auVar73._8_4_);
      auVar70._12_4_ = -(uint)(iVar77 < auVar73._12_4_);
      auVar26._4_4_ = auVar70._0_4_;
      auVar26._0_4_ = auVar70._0_4_;
      auVar26._8_4_ = auVar70._8_4_;
      auVar26._12_4_ = auVar70._8_4_;
      auVar53 = pshuflw(auVar94,auVar26,0xe8);
      auVar59._0_4_ = -(uint)(auVar73._0_4_ == iVar39);
      auVar59._4_4_ = -(uint)(auVar73._4_4_ == iVar75);
      auVar59._8_4_ = -(uint)(auVar73._8_4_ == iVar76);
      auVar59._12_4_ = -(uint)(auVar73._12_4_ == iVar77);
      auVar88._4_4_ = auVar59._4_4_;
      auVar88._0_4_ = auVar59._4_4_;
      auVar88._8_4_ = auVar59._12_4_;
      auVar88._12_4_ = auVar59._12_4_;
      auVar73 = pshuflw(auVar59,auVar88,0xe8);
      auVar89._4_4_ = auVar70._4_4_;
      auVar89._0_4_ = auVar70._4_4_;
      auVar89._8_4_ = auVar70._12_4_;
      auVar89._12_4_ = auVar70._12_4_;
      auVar78 = pshuflw(auVar70,auVar89,0xe8);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar73 = packssdw(auVar73 & auVar53,(auVar78 | auVar73 & auVar53) ^ auVar12);
      auVar73 = packsswb(auVar73,auVar73);
      if ((auVar73 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar46[-0xa8] = false;
      }
      auVar27._4_4_ = auVar70._0_4_;
      auVar27._0_4_ = auVar70._0_4_;
      auVar27._8_4_ = auVar70._8_4_;
      auVar27._12_4_ = auVar70._8_4_;
      auVar89 = auVar88 & auVar27 | auVar89;
      auVar78 = packssdw(auVar89,auVar89);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar73 = packssdw(auVar73,auVar78 ^ auVar13);
      auVar73 = packsswb(auVar73,auVar73);
      if ((auVar73._12_2_ >> 8 & 1) != 0) {
        pbVar46[-0x70] = false;
      }
      auVar73 = (auVar71 | _DAT_0201ce50) ^ auVar62;
      auVar60._0_4_ = -(uint)(iVar39 < auVar73._0_4_);
      auVar60._4_4_ = -(uint)(iVar75 < auVar73._4_4_);
      auVar60._8_4_ = -(uint)(iVar76 < auVar73._8_4_);
      auVar60._12_4_ = -(uint)(iVar77 < auVar73._12_4_);
      auVar90._4_4_ = auVar60._0_4_;
      auVar90._0_4_ = auVar60._0_4_;
      auVar90._8_4_ = auVar60._8_4_;
      auVar90._12_4_ = auVar60._8_4_;
      auVar72._4_4_ = -(uint)(auVar73._4_4_ == iVar75);
      auVar72._12_4_ = -(uint)(auVar73._12_4_ == iVar77);
      auVar72._0_4_ = auVar72._4_4_;
      auVar72._8_4_ = auVar72._12_4_;
      auVar74._4_4_ = auVar60._4_4_;
      auVar74._0_4_ = auVar60._4_4_;
      auVar74._8_4_ = auVar60._12_4_;
      auVar74._12_4_ = auVar60._12_4_;
      auVar78 = auVar72 & auVar90 | auVar74;
      auVar73 = packssdw(auVar60,auVar78);
      auVar14._8_4_ = 0xffffffff;
      auVar14._0_8_ = 0xffffffffffffffff;
      auVar14._12_4_ = 0xffffffff;
      auVar73 = packssdw(auVar73 ^ auVar14,auVar73 ^ auVar14);
      auVar73 = packsswb(auVar73,auVar73);
      if ((auVar73 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar46[-0x38] = false;
      }
      auVar73 = pshufhw(auVar73,auVar90,0x84);
      in_XMM2 = pshufhw(auVar78,auVar72,0x84);
      in_XMM2 = in_XMM2 & auVar73;
      auVar73 = pshufhw(auVar73,auVar74,0x84);
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar61 = (auVar73 | in_XMM2) ^ auVar61;
      auVar73 = packssdw(auVar61,auVar61);
      in_XMM1 = packsswb(auVar73,auVar73);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *pbVar46 = false;
      }
      uVar48 = uVar48 + 0x10;
      pbVar46 = pbVar46 + 0x380;
    } while ((uVar42 / 7 + 0x10 & 0xfffffffffffffff0) != uVar48);
  }
  (this->levels).super_RawBufferView.modified = false;
  (this->edge_creases).super_RawBufferView.modified = false;
  (this->edge_crease_weights).super_RawBufferView.modified = false;
  (this->vertex_creases).super_RawBufferView.modified = false;
  (this->vertex_crease_weights).super_RawBufferView.modified = false;
  local_330 = (vector_t<unsigned_int,_embree::aligned_monitored_allocator<unsigned_int,_4UL>_> *)
              getSeconds();
  bVar37 = State::verbosity(&((this->super_Geometry).device)->super_State,2);
  if (bVar37) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"half edge generation = ",0x17);
    local_330 = (vector_t<unsigned_int,_embree::aligned_monitored_allocator<unsigned_int,_4UL>_> *)
                ((double)local_330 - local_308);
    poVar43 = std::ostream::_M_insert<double>((double)local_330 * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar43,"ms, ",4);
    auVar62._0_8_ = (double)CONCAT44(0x43300000,(int)this->numHalfEdges);
    auVar62._8_4_ = (int)(this->numHalfEdges >> 0x20);
    auVar62._12_4_ = 0x45300000;
    poVar43 = std::ostream::_M_insert<double>
                        ((((auVar62._8_8_ - 1.9342813113834067e+25) +
                          (auVar62._0_8_ - 4503599627370496.0)) * 1e-06) / (double)local_330);
    std::__ostream_insert<char,std::char_traits<char>>(poVar43,"M/s",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar43 + -0x18) + (char)poVar43);
    std::ostream::put((char)poVar43);
    std::ostream::flush();
    printStatistics(this);
  }
  return;
}

Assistant:

void SubdivMesh::initializeHalfEdgeStructures ()
  {
    double t0 = getSeconds();

    invalid_face.resize(numFaces()*numTimeSteps);
 
    /* calculate start edge of each face */
    faceStartEdge.resize(numFaces());
    
    if (faceVertices.isLocalModified())
    {
      numHalfEdges = parallel_prefix_sum(faceVertices,faceStartEdge,numFaces(),0,std::plus<unsigned>());

      /* calculate face of each half edge */
      halfEdgeFace.resize(numHalfEdges);
      for (size_t f=0, h=0; f<numFaces(); f++)
        for (size_t e=0; e<faceVertices[f]; e++)
          halfEdgeFace[h++] = (unsigned int) f;
    }
    
    /* create set with all vertex creases */
    if (vertex_creases.isLocalModified() || vertex_crease_weights.isLocalModified())
      vertexCreaseMap->vertexCreaseMap.init(vertex_creases,vertex_crease_weights);
    
    /* create map with all edge creases */
    if (edge_creases.isLocalModified() || edge_crease_weights.isLocalModified())
      edgeCreaseMap->edgeCreaseMap.init(edge_creases,edge_crease_weights);

    /* create set with all holes */
    if (holes.isLocalModified())
      holeSet->holeSet.init(holes);

    /* create topology */
    for (auto& t: topology)
      t.initializeHalfEdgeStructures();

    /* create interpolation cache mapping for interpolatable meshes */
    for (size_t i=0; i<vertex_buffer_tags.size(); i++)
      vertex_buffer_tags[i].resize(numFaces()*numInterpolationSlots4(vertices[i].getStride()));
    for (size_t i=0; i<vertexAttribs.size(); i++)
      if (vertexAttribs[i]) vertex_attrib_buffer_tags[i].resize(numFaces()*numInterpolationSlots4(vertexAttribs[i].getStride()));

    /* cleanup some state for static scenes */
    /* if (scene_ == nullptr || scene_->isStaticAccel()) 
    {
      vertexCreaseMap->vertexCreaseMap.clear();
      edgeCreaseMap->edgeCreaseMap.clear();
    } */

    /* clear modified state of all buffers */
    faceVertices.clearLocalModified();
    holes.clearLocalModified();
    for (auto& buffer : vertices) buffer.clearLocalModified(); 
    levels.clearLocalModified();
    edge_creases.clearLocalModified();
    edge_crease_weights.clearLocalModified();
    vertex_creases.clearLocalModified();
    vertex_crease_weights.clearLocalModified();

    double t1 = getSeconds();

    /* print statistics in verbose mode */
    if (device->verbosity(2)) {
      std::cout << "half edge generation = " << 1000.0*(t1-t0) << "ms, " << 1E-6*double(numHalfEdges)/(t1-t0) << "M/s" << std::endl;
      printStatistics();
    }
  }